

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

size_t __thiscall OpenMesh::PropertyT<char>::size_of(PropertyT<char> *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t sVar3;
  size_t sVar4;
  
  iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xc])();
  if (CONCAT44(extraout_var,iVar1) == -1) {
    sVar4 = (long)(this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    sVar3 = 0;
    if (sVar4 != 0) {
      sVar3 = sVar4;
    }
  }
  else {
    iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])(this);
    iVar2 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xc])(this);
    if (CONCAT44(extraout_var_01,iVar2) == -1) {
      sVar3 = 0xffffffffffffffff;
    }
    else {
      iVar2 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xc])(this);
      sVar3 = CONCAT44(extraout_var_02,iVar2) * CONCAT44(extraout_var_00,iVar1);
    }
  }
  return sVar3;
}

Assistant:

virtual size_t size_of(void) const
  {
    if (element_size() != IO::UnknownSize)
      return this->BaseProperty::size_of(n_elements());
    return std::accumulate(data_.begin(), data_.end(), size_t(0), plus());
  }